

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::GenerateCommentForDecoratedId
          (InstructionDisassembler *this,spv_parsed_instruction_t *inst)

{
  uint16_t uVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  uint16_t i;
  ushort operand_index;
  ostringstream partial;
  uint32_t local_1cc;
  string local_1c8 [8];
  long local_1c0;
  ostringstream local_1a8 [376];
  
  if (this->comment_ != 0) {
    uVar1 = inst->opcode;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    if (uVar1 == 0x47) {
      uVar2 = inst->words[inst->operands->offset];
      pcVar4 = "";
      local_1cc = uVar2;
      for (operand_index = 1; operand_index < inst->num_operands; operand_index = operand_index + 1)
      {
        std::operator<<((ostream *)local_1a8,pcVar4);
        EmitOperand(this,(ostream *)local_1a8,inst,operand_index);
        pcVar4 = " ";
      }
      if (uVar2 != 0) {
        pmVar3 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->id_comments_,&local_1cc);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_dispose();
        if (local_1c0 != 0) {
          std::operator<<((ostream *)pmVar3,", ");
        }
        std::__cxx11::stringbuf::str();
        std::operator<<((ostream *)pmVar3,local_1c8);
        std::__cxx11::string::_M_dispose();
      }
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    return;
  }
  __assert_fail("comment_",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                ,0x310,
                "void spvtools::disassemble::InstructionDisassembler::GenerateCommentForDecoratedId(const spv_parsed_instruction_t &)"
               );
}

Assistant:

void InstructionDisassembler::GenerateCommentForDecoratedId(
    const spv_parsed_instruction_t& inst) {
  assert(comment_);
  auto opcode = static_cast<spv::Op>(inst.opcode);

  std::ostringstream partial;
  uint32_t id = 0;
  const char* separator = "";

  switch (opcode) {
    case spv::Op::OpDecorate:
      // Take everything after `OpDecorate %id` and associate it with id.
      id = inst.words[inst.operands[0].offset];
      for (uint16_t i = 1; i < inst.num_operands; i++) {
        partial << separator;
        separator = " ";
        EmitOperand(partial, inst, i);
      }
      break;
    default:
      break;
  }

  if (id == 0) {
    return;
  }

  // Add the new comment to the comments of this id
  std::ostringstream& id_comment = id_comments_[id];
  if (!id_comment.str().empty()) {
    id_comment << ", ";
  }
  id_comment << partial.str();
}